

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

uint int_log(uint base,uint x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint *puVar5;
  int iVar6;
  uint auStack_88 [2];
  uint powers [32];
  
  uVar2 = 0x7fffffff;
  if (1 < base) {
    if (base == 2) {
      uVar2 = uint32_log2(x);
      return uVar2;
    }
    if (x == 0) {
      uVar2 = 0x80000000;
    }
    else {
      uVar2 = 0;
      uVar3 = 0;
      if (base <= x) {
        uVar3 = 0;
        do {
          auStack_88[uVar3] = base;
          if (0xffff < base) break;
          base = base * base;
          uVar3 = uVar3 + 1;
        } while (base <= x);
      }
      if (uVar3 != 0) {
        uVar4 = (ulong)(uVar3 - 1);
        puVar5 = auStack_88 + uVar4;
        uVar3 = 1;
        uVar2 = 0;
        do {
          iVar6 = 1 << ((byte)uVar4 & 0x1f);
          uVar1 = *puVar5 * uVar3;
          if (x < *puVar5 * uVar3) {
            iVar6 = 0;
            uVar1 = uVar3;
          }
          uVar3 = uVar1;
          uVar2 = uVar2 + iVar6;
          puVar5 = puVar5 + -1;
          iVar6 = (int)uVar4;
          uVar4 = (ulong)(iVar6 - 1);
        } while (iVar6 != 0);
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned int_log( unsigned base, unsigned x )
{
    unsigned q = base;
    unsigned y = 1, result = 0;
    unsigned powers[ CHAR_BIT*sizeof(unsigned) ];

    /*
     We use that we want to find a binary representation
     of the log base q of x
    
     Find n s.t. q^n = x
    
     Or when n is in base 2
    
     q^(a_0 2^0 + ... + a_m 2^m ) = x 
    
       <=>
    
     q^a_0 * (q^2)^a_1 * (q^4)^a_2 * ... * (q^(2^m))^a_m = x

     So, first find the largest k s.t. q^(2^k) < x
    */

    unsigned k = 0;
    unsigned power = 1;
    unsigned next_power = q;

    if ( q == 0 || q == 1 )
        return INT_MAX;

    if ( q == 2 )
        return int_log2( x );

    if ( x == 0 )
        return INT_MIN;

    while ( next_power <= x ) {
        power = next_power;
        powers[ k ] = power;
        if ( next_power > UINT_MAX/next_power)
            break;
        next_power = next_power * next_power;
        k += 1;
    }

    /* Now we can find the logarithm */
    while (k > 0) {
        k--;
        if (y * powers[k] <= x) {
            y *= powers[k];
            result += (1 << k);
        }
    }
        
    return result;
}